

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

void __thiscall pbrt::RGBFilm::WriteImage(RGBFilm *this,ImageMetadata *metadata,Float splatScale)

{
  Image *in_RSI;
  long in_RDI;
  Image image;
  undefined4 in_stack_000000e0;
  ImageMetadata *in_stack_00000b30;
  string *in_stack_00000b38;
  Image *in_stack_00000b40;
  string local_e0 [40];
  Bounds2<int> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  LogLevel in_stack_ffffffffffffff74;
  
  GetImage((RGBFilm *)metadata,(ImageMetadata *)CONCAT44(splatScale,in_stack_000000e0),
           image.p32.nStored._4_4_);
  if (logging::logLevel < 1) {
    Log<std::__cxx11::string&,pbrt::Bounds2<int>&>
              (in_stack_ffffffffffffff74,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
               in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  std::__cxx11::string::string(local_e0,(string *)(in_RDI + 0x30));
  Image::Write(in_stack_00000b40,in_stack_00000b38,in_stack_00000b30);
  std::__cxx11::string::~string(local_e0);
  Image::~Image(in_RSI);
  return;
}

Assistant:

void RGBFilm::WriteImage(ImageMetadata metadata, Float splatScale) {
    Image image = GetImage(&metadata, splatScale);
    LOG_VERBOSE("Writing image %s with bounds %s", filename, pixelBounds);
    image.Write(filename, metadata);
}